

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.h
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::_internal_has_generated_code_info
          (CodeGeneratorResponse_File *this)

{
  uint uVar1;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if (((uVar1 & 8) != 0) && (this->generated_code_info_ == (GeneratedCodeInfo *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.h"
               ,0x677);
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: !value || generated_code_info_ != nullptr: ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return SUB41((uVar1 & 8) >> 3,0);
}

Assistant:

inline bool CodeGeneratorResponse_File::_internal_has_generated_code_info() const {
  bool value = (_has_bits_[0] & 0x00000008u) != 0;
  PROTOBUF_ASSUME(!value || generated_code_info_ != nullptr);
  return value;
}